

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O0

curl_slist * curl_slist_append(curl_slist *list,char *data)

{
  char *data_00;
  char *dupdata;
  char *data_local;
  curl_slist *list_local;
  
  data_00 = (*Curl_cstrdup)(data);
  if (data_00 == (char *)0x0) {
    list_local = (curl_slist *)0x0;
  }
  else {
    list_local = Curl_slist_append_nodup(list,data_00);
    if (list_local == (curl_slist *)0x0) {
      (*Curl_cfree)(data_00);
    }
  }
  return list_local;
}

Assistant:

struct curl_slist *curl_slist_append(struct curl_slist *list,
                                     const char *data)
{
  char *dupdata = strdup(data);

  if(!dupdata)
    return NULL;

  list = Curl_slist_append_nodup(list, dupdata);
  if(!list)
    free(dupdata);

  return list;
}